

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
DumpStats(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  Page *pPVar5;
  long lVar6;
  undefined1 local_40 [8];
  EditingIterator bucketIter;
  
  Output::Print(L"Total allocation size: %d\n",this->totalAllocationSize);
  Output::Flush();
  Output::Print(L"Total free size: %d\n",this->freeObjectSize);
  Output::Flush();
  Output::Print(L"Total allocations since last compact: %d\n",this->allocationsSinceLastCompact);
  Output::Flush();
  Output::Print(L"Total frees since last compact: %d\n",this->freesSinceLastCompact);
  Output::Flush();
  Output::Print(L"Large object count: %d\n",
                (ulong)(this->largeObjectAllocations).super_RealCount.count);
  Output::Flush();
  Output::Print(L"Buckets: \n");
  Output::Flush();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar6 = 0;
  do {
    if (lVar6 == 7) {
      return;
    }
    Output::Print(L"\t%d => %u [",(ulong)(uint)(0x80 << ((byte)lVar6 & 0x1f)),
                  (ulong)this->buckets[lVar6].super_RealCount.count);
    local_40 = (undefined1  [8])(this->buckets + lVar6);
    bucketIter.super_Iterator.list = this->buckets + lVar6;
    while( true ) {
      if (bucketIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bucketIter.super_Iterator.list =
           ((bucketIter.super_Iterator.list)->super_DListNodeBase<Memory::CustomHeap::Page>).next.
           list;
      if ((undefined1  [8])bucketIter.super_Iterator.list == local_40) break;
      pPVar5 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data((Iterator *)local_40);
      BVar3 = BVUnitT<unsigned_long>::CountBit(~(pPVar5->freeBitVector).word);
      Output::Print(L" %u ",(ulong)(BVar3 << 7));
    }
    bucketIter.super_Iterator.list = (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0;
    Output::Print(L"] {{%u}}\n",(ulong)this->fullPages[lVar6].super_RealCount.count);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::DumpStats()
{
    HeapTrace(_u("Total allocation size: %d\n"), totalAllocationSize);
    HeapTrace(_u("Total free size: %d\n"), freeObjectSize);
    HeapTrace(_u("Total allocations since last compact: %d\n"), allocationsSinceLastCompact);
    HeapTrace(_u("Total frees since last compact: %d\n"), freesSinceLastCompact);
    HeapTrace(_u("Large object count: %d\n"), this->largeObjectAllocations.Count());

    HeapTrace(_u("Buckets: \n"));
    for (int i = 0; i < BucketId::NumBuckets; i++)
    {
        Output::Print(_u("\t%d => %u ["), (1 << (i + 7)), buckets[i].Count());

        FOREACH_DLISTBASE_ENTRY_EDITING(Page, page, &this->buckets[i], bucketIter)
        {
            BVUnit usedBitVector = page.freeBitVector;
            usedBitVector.ComplimentAll(); // Get the actual used bit vector
            Output::Print(_u(" %u "), usedBitVector.Count() * Page::Alignment); // Print out the space used in this page
        }

        NEXT_DLISTBASE_ENTRY_EDITING
            Output::Print(_u("] {{%u}}\n"), this->fullPages[i].Count());
    }
}